

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O2

URL * __thiscall
miniros::master::AddressResolver::resolveAddressFor
          (URL *__return_storage_ptr__,AddressResolver *this,
          shared_ptr<miniros::master::NodeRef> *node,NetAddress *remoteAddress,
          NetAddress *localAddress)

{
  NodeRef *this_00;
  bool bVar1;
  _Base_ptr p_Var2;
  pthread_mutex_t *__mutex;
  weak_ptr<const_miniros::master::HostInfo> wVar3;
  allocator<char> local_a9;
  pthread_mutex_t *local_a8;
  undefined1 local_a0 [32];
  shared_ptr<miniros::master::HostInfo> requesterHost;
  shared_ptr<const_miniros::master::HostInfo> nodeHost;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (node->super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 == (NodeRef *)0x0) {
    network::URL::URL(__return_storage_ptr__);
  }
  else {
    NodeRef::getUrl(__return_storage_ptr__,this_00);
    __mutex = (pthread_mutex_t *)&this->m_mutex;
    ::std::mutex::lock((mutex *)&__mutex->__data);
    if (this->m_resolveIp != false) {
      local_a8 = __mutex;
      wVar3 = NodeRef::hostInfo((NodeRef *)local_a0);
      ::std::__shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&nodeHost.
                  super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>,
                 local_a0,wVar3.
                          super___weak_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._M_pi);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
      __mutex = local_a8;
      if (nodeHost.super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (resolveAddressFor::loc.initialized_ == false) {
          ::std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"miniros.unknown_package",&local_a9);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &requesterHost,&local_50,".");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&requesterHost,"resolver");
          console::initializeLogLocation(&resolveAddressFor::loc,(string *)local_a0,Warn);
          ::std::__cxx11::string::~string((string *)local_a0);
          ::std::__cxx11::string::~string((string *)&requesterHost);
          ::std::__cxx11::string::~string((string *)&local_50);
          __mutex = local_a8;
        }
        if (resolveAddressFor::loc.level_ != Warn) {
          console::setLogLocationLevel(&resolveAddressFor::loc,Warn);
          console::checkLogLocationEnabled(&resolveAddressFor::loc);
        }
        if (resolveAddressFor::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,resolveAddressFor::loc.logger_,
                         resolveAddressFor::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/resolver.cpp"
                         ,0x98,
                         "network::URL miniros::master::AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef> &, const network::NetAddress &, const network::NetAddress &) const"
                         ,"No HostInfo for node %s",
                         (((node->
                           super___shared_ptr<miniros::master::NodeRef,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr)->m_id)._M_dataplus._M_p);
        }
      }
      else {
        findHost((AddressResolver *)&requesterHost,(NetAddress *)this);
        if (requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0 ||
            nodeHost.super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr !=
            requesterHost.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr) {
          if ((nodeHost.
               super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->local == true) {
            ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
          else if (((nodeHost.
                     super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->addresses)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
            for (p_Var2 = ((nodeHost.
                            super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                ; (_Rb_tree_header *)p_Var2 !=
                  &((nodeHost.
                     super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->addresses)._M_t._M_impl.super__Rb_tree_header;
                p_Var2 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2)) {
              bVar1 = network::NetAddress::isLocal((NetAddress *)(p_Var2 + 1));
              if (!bVar1) {
                network::NetAddress::str_abi_cxx11_((string *)local_a0,(NetAddress *)(p_Var2 + 1));
                ::std::__cxx11::string::operator=
                          ((string *)__return_storage_ptr__,(string *)local_a0);
                ::std::__cxx11::string::~string((string *)local_a0);
                break;
              }
            }
          }
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&requesterHost.
                    super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        __mutex = local_a8;
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&nodeHost.
                  super___shared_ptr<const_miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    pthread_mutex_unlock(__mutex);
  }
  return __return_storage_ptr__;
}

Assistant:

network::URL AddressResolver::resolveAddressFor(const std::shared_ptr<NodeRef>& node,
  const network::NetAddress& remoteAddress,
  const network::NetAddress& localAddress) const
{
  assert(node);
  if (!node)
    return {};

  network::URL url = node->getUrl();

  std::scoped_lock lock(m_mutex);
  if (!m_resolveIp)
    return url;

  auto nodeHost = node->hostInfo().lock();
  if (!nodeHost) {
    MINIROS_WARN_NAMED("resolver", "No HostInfo for node %s", node->id().c_str());
    return url;
  }

  auto requesterHost = findHost(remoteAddress);
  if (requesterHost && nodeHost == requesterHost) {
    // Both requester and node are on the same host. No additional resolution is needed.
    return url;
  }

  if (nodeHost->local) {
    // Node located on this host. We can use localAddress as a good IP for a requester.
    url.host = localAddress.address;
    return url;
  }

  // Here both node and requester are located on different machines and node is not located on a local host.
  if (!nodeHost->addresses.empty()) {
    // Find first usable address.
    for (const auto& addr: nodeHost->addresses) {
      if (!addr.isLocal()) {
        url.host = addr.str();
        break;
      }
    }
  }
  return url;
}